

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

CharPtr __thiscall
fmt::BasicWriter<wchar_t>::write_str<wchar_t>
          (BasicWriter<wchar_t> *this,wchar_t *s,size_t size,AlignSpec *spec)

{
  CharPtr buffer;
  uint uVar1;
  wchar_t value;
  Alignment AVar2;
  wchar_t *pwVar3;
  wchar_t local_34;
  CharPtr pwStack_30;
  wchar_t fill;
  CharPtr out;
  AlignSpec *spec_local;
  size_t size_local;
  wchar_t *s_local;
  BasicWriter<wchar_t> *this_local;
  
  pwStack_30 = (CharPtr)0x0;
  out = (CharPtr)spec;
  spec_local = (AlignSpec *)size;
  size_local = (size_t)s;
  s_local = (wchar_t *)this;
  uVar1 = WidthSpec::width(&spec->super_WidthSpec);
  if (spec_local < (AlignSpec *)(ulong)uVar1) {
    uVar1 = WidthSpec::width((WidthSpec *)out);
    pwStack_30 = grow_buffer(this,(ulong)uVar1);
    value = WidthSpec::fill((WidthSpec *)out);
    local_34 = internal::BasicCharTraits<wchar_t>::cast(value);
    AVar2 = AlignSpec::align((AlignSpec *)out);
    pwVar3 = pwStack_30;
    if (AVar2 == ALIGN_RIGHT) {
      uVar1 = WidthSpec::width((WidthSpec *)out);
      std::fill_n<wchar_t*,unsigned_long,wchar_t>(pwVar3,(ulong)uVar1 - (long)spec_local,&local_34);
      uVar1 = WidthSpec::width((WidthSpec *)out);
      pwStack_30 = pwStack_30 + ((ulong)uVar1 - (long)spec_local);
    }
    else {
      AVar2 = AlignSpec::align((AlignSpec *)out);
      buffer = pwStack_30;
      if (AVar2 == ALIGN_CENTER) {
        uVar1 = WidthSpec::width((WidthSpec *)out);
        pwStack_30 = fill_padding(buffer,uVar1,(size_t)spec_local,local_34);
      }
      else {
        pwVar3 = pwStack_30 + (long)spec_local;
        uVar1 = WidthSpec::width((WidthSpec *)out);
        std::fill_n<wchar_t*,unsigned_long,wchar_t>
                  (pwVar3,(ulong)uVar1 - (long)spec_local,&local_34);
      }
    }
  }
  else {
    pwStack_30 = grow_buffer(this,(size_t)spec_local);
  }
  std::copy<wchar_t_const*,wchar_t*>
            ((wchar_t *)size_local,(wchar_t *)(size_local + (long)spec_local * 4),pwStack_30);
  return pwStack_30;
}

Assistant:

typename BasicWriter<Char>::CharPtr BasicWriter<Char>::write_str(
      const StrChar *s, std::size_t size, const AlignSpec &spec) {
  CharPtr out = CharPtr();
  if (spec.width() > size) {
    out = grow_buffer(spec.width());
    Char fill = internal::CharTraits<Char>::cast(spec.fill());
    if (spec.align() == ALIGN_RIGHT) {
      std::fill_n(out, spec.width() - size, fill);
      out += spec.width() - size;
    } else if (spec.align() == ALIGN_CENTER) {
      out = fill_padding(out, spec.width(), size, fill);
    } else {
      std::fill_n(out + size, spec.width() - size, fill);
    }
  } else {
    out = grow_buffer(size);
  }
  std::copy(s, s + size, out);
  return out;
}